

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O1

void __thiscall QUndoGroup::removeStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  difference_type dVar2;
  long in_FS_OFFSET;
  QUndoStack *local_30;
  anon_class_8_1_54a39814_for__M_pred_conflict10 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_28.t = (QAction **)&local_30;
  local_30 = stack;
  dVar2 = QtPrivate::
          sequential_erase_if<QList<QUndoStack*>,QtPrivate::sequential_erase<QList<QUndoStack*>,QUndoStack*>(QList<QUndoStack*>&,QUndoStack*const&)::_lambda(auto:1_const&)_1_>
                    ((QList<QUndoStack_*> *)(lVar1 + 0x80),&local_28);
  if (dVar2 != 0) {
    if (*(QUndoStack **)(lVar1 + 0x78) == stack) {
      setActiveStack(this,(QUndoStack *)0x0);
    }
    *(undefined8 *)(*(long *)&stack->field_0x8 + 0xb0) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::removeStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.removeAll(stack) == 0)
        return;
    if (stack == d->active)
        setActiveStack(nullptr);
    stack->d_func()->group = nullptr;
}